

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::SubstringFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  FunctionNullHandling in_stack_fffffffffffffc38;
  allocator_type local_3c1;
  ScalarFunctionSet *bind_lambda;
  scalar_function_t local_3b8;
  scalar_function_t local_398;
  LogicalType local_378;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_360;
  LogicalType local_348;
  LogicalType local_330 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e8;
  LogicalType local_2d0;
  LogicalType local_2b8;
  string local_2a0;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"substring","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  bind_lambda = in_RDI;
  LogicalType::LogicalType(local_330,VARCHAR);
  LogicalType::LogicalType(local_330 + 1,BIGINT);
  LogicalType::LogicalType(local_330 + 2,BIGINT);
  __l._M_len = 3;
  __l._M_array = local_330;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2e8,__l,&local_3c1);
  LogicalType::LogicalType(&local_348,VARCHAR);
  local_398.super__Function_base._M_functor._8_8_ = 0;
  local_398.super__Function_base._M_functor._M_unused._M_object =
       SubstringFunction<duckdb::SubstringUnicodeOp>;
  local_398._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_398.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2b8,INVALID);
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_2e8,&local_348,&local_398,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             SubstringPropagateStats,(init_local_state_t)0x0,(LogicalType)ZEXT824(&local_2b8),
             CONSISTENT,in_stack_fffffffffffffc38,(bind_lambda_function_t)bind_lambda);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2b8);
  if (local_398.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_398.super__Function_base._M_manager)
              ((_Any_data *)&local_398,(_Any_data *)&local_398,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_348);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2e8);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_330[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_330,VARCHAR);
  LogicalType::LogicalType(local_330 + 1,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_330;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_360,__l_00,&local_3c1);
  LogicalType::LogicalType(&local_378,VARCHAR);
  local_3b8.super__Function_base._M_functor._8_8_ = 0;
  local_3b8.super__Function_base._M_functor._M_unused._M_object =
       SubstringFunction<duckdb::SubstringUnicodeOp>;
  local_3b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2d0,INVALID);
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_360,&local_378,&local_3b8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             SubstringPropagateStats,(init_local_state_t)0x0,(LogicalType)ZEXT824(&local_2d0),
             CONSISTENT,in_stack_fffffffffffffc38,(bind_lambda_function_t)bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2d0);
  if (local_3b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3b8.super__Function_base._M_manager)
              ((_Any_data *)&local_3b8,(_Any_data *)&local_3b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_378);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_360);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_330[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return bind_lambda;
}

Assistant:

ScalarFunctionSet SubstringFun::GetFunctions() {
	ScalarFunctionSet substr("substring");
	substr.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::BIGINT, LogicalType::BIGINT},
	                                  LogicalType::VARCHAR, SubstringFunction<SubstringUnicodeOp>, nullptr, nullptr,
	                                  SubstringPropagateStats));
	substr.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::BIGINT}, LogicalType::VARCHAR,
	                                  SubstringFunction<SubstringUnicodeOp>, nullptr, nullptr,
	                                  SubstringPropagateStats));
	return (substr);
}